

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O2

bool __thiscall
Am_Image_Array_Data::Get_RGB_Image(Am_Image_Array_Data *this,uchar *storage,bool top_first)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Am_RGB_Value *pAVar4;
  uchar uVar5;
  bool bVar6;
  int iVar7;
  Am_Generic_Image *pAVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uchar *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  
  pAVar8 = this->image_;
  if (pAVar8 == (Am_Generic_Image *)0x0) {
    bVar6 = make_generic_image_from_name(this);
    if (!bVar6) {
      return false;
    }
    pAVar8 = this->image_;
  }
  puVar13 = pAVar8->imdata;
  if (puVar13 == (uchar *)0x0) {
    return false;
  }
  uVar2 = (pAVar8->iminfo).width;
  uVar14 = (ulong)uVar2;
  uVar3 = (pAVar8->iminfo).height;
  uVar15 = (ulong)uVar3;
  if (this->name == (char *)0x0) {
    uVar16 = uVar2 + 7 & 0xfffffff8;
    if (top_first) {
      iVar7 = 0;
      lVar12 = 0;
      for (uVar11 = 0; uVar11 != uVar3; uVar11 = uVar11 + 1) {
        lVar12 = (long)(int)lVar12;
        for (uVar18 = 0; uVar2 != uVar18; uVar18 = uVar18 + 1) {
          uVar5 = -((Get_RGB_Image::byte_array[uVar18 & 7] & puVar13[iVar7 + uVar18 >> 3]) != 0);
          storage[lVar12] = uVar5;
          storage[lVar12 + 1] = uVar5;
          storage[lVar12 + 2] = uVar5;
          lVar12 = lVar12 + 3;
        }
        iVar7 = iVar7 + uVar16;
      }
    }
    else {
      iVar7 = (uVar3 - 1) * (uVar2 + 7 >> 3) * 8;
      lVar12 = 0;
      while (0 < (int)uVar15) {
        uVar15 = (ulong)((int)uVar15 - 1);
        lVar12 = (long)(int)lVar12;
        uVar10 = uVar14;
        iVar9 = iVar7;
        while (iVar19 = (int)uVar10, uVar10 = (ulong)(iVar19 - 1), iVar19 != 0) {
          uVar5 = -((Get_RGB_Image::byte_array[iVar9 % 8] & puVar13[iVar9 / 8]) != 0);
          storage[lVar12] = uVar5;
          storage[lVar12 + 1] = uVar5;
          storage[lVar12 + 2] = uVar5;
          lVar12 = lVar12 + 3;
          iVar9 = iVar9 + 1;
        }
        iVar7 = iVar7 - uVar16;
      }
    }
  }
  else {
    pAVar4 = pAVar8->color_map;
    if (top_first) {
      lVar12 = 0;
      for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
        lVar12 = (long)(int)lVar12;
        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
          bVar1 = puVar13[uVar17];
          storage[lVar12] = (uchar)pAVar4[bVar1].red;
          storage[lVar12 + 1] = (uchar)pAVar4[bVar1].green;
          storage[lVar12 + 2] = (uchar)pAVar4[bVar1].blue;
          lVar12 = lVar12 + 3;
        }
        puVar13 = puVar13 + uVar14;
      }
    }
    else {
      puVar13 = puVar13 + (uVar15 - 1) * uVar14;
      lVar12 = 0;
      while (0 < (long)uVar15) {
        uVar15 = uVar15 - 1;
        lVar12 = (long)(int)lVar12;
        for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
          bVar1 = puVar13[uVar10];
          storage[lVar12] = (uchar)pAVar4[bVar1].red;
          storage[lVar12 + 1] = (uchar)pAVar4[bVar1].green;
          storage[lVar12 + 2] = (uchar)pAVar4[bVar1].blue;
          lVar12 = lVar12 + 3;
        }
        puVar13 = puVar13 + -uVar14;
      }
    }
  }
  return true;
}

Assistant:

bool
Am_Image_Array_Data::Get_RGB_Image(unsigned char *storage, bool top_first)
{
  if (image_ == nullptr) {
    if (!make_generic_image_from_name())
      return false;
  }

  unsigned char *idata = image_->Get_Data();
  if (idata == nullptr)
    return false;

  unsigned short width, height;
  image_->Get_Size(width, height);

  if (name) {
    // image from file; with colormap
    Am_RGB_Value *ctbl;
    int row, col, index;

    (void)image_->Get_Color_Map(ctbl);
    index = 0;

    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    }
  } else {
    // image from bit data
    // this is how I think X stores bitmaps:
    // - the number of bits in a row is the width of the image is
    //   rounded up to an even multiple of 8
    // - the bits in a byte are stored from right to left !
    int row, col, index;
    static unsigned char byte_array[] = {0x01, 0x02, 0x04, 0x08,
                                         0x10, 0x20, 0x40, 0x80};
    int row_width = (width + 7) / 8 * 8; // round to nearest byte;

    index = 0;
    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    }
  }
  return true;
}